

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcolumnview.cpp
# Opt level: O2

QSize __thiscall QColumnView::sizeHint(QColumnView *this)

{
  long lVar1;
  undefined8 uVar2;
  QSize QVar3;
  ulong uVar4;
  int i;
  ulong uVar5;
  QSize QVar6;
  
  lVar1 = *(long *)&(this->super_QAbstractItemView).super_QAbstractScrollArea.super_QFrame.
                    super_QWidget.field_0x8;
  QVar6.wd.m_i = -1;
  QVar6.ht.m_i = -1;
  uVar5 = 0;
  uVar4 = 0xffffffff;
  while( true ) {
    if (*(ulong *)(lVar1 + 0x550) <= uVar5) break;
    uVar2 = (**(code **)(**(long **)(*(long *)(lVar1 + 0x548) + uVar5 * 8) + 0x70))();
    QVar6.wd.m_i = QVar6.wd.m_i.m_i + (int)uVar2;
    QVar6.ht.m_i = 0;
    uVar4 = (ulong)(uint)((int)uVar4 + (int)((ulong)uVar2 >> 0x20));
    uVar5 = uVar5 + 1;
  }
  QVar3 = QAbstractScrollArea::sizeHint((QAbstractScrollArea *)this);
  if (QVar6.wd.m_i.m_i <= QVar3.wd.m_i.m_i) {
    QVar6 = QVar3;
  }
  uVar5 = (ulong)QVar3 >> 0x20;
  if (QVar3.ht.m_i.m_i < (int)uVar4) {
    uVar5 = uVar4;
  }
  return (QSize)(uVar5 << 0x20 | (ulong)QVar6 & 0xffffffff);
}

Assistant:

QSize QColumnView::sizeHint() const
{
    Q_D(const QColumnView);
    QSize sizeHint;
    for (int i = 0; i < d->columns.size(); ++i) {
        sizeHint += d->columns.at(i)->sizeHint();
    }
    return sizeHint.expandedTo(QAbstractItemView::sizeHint());
}